

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.h
# Opt level: O3

void __thiscall VmBlock::~VmBlock(VmBlock *this)

{
  (this->super_VmValue)._vptr_VmValue = (_func_int **)&PTR__VmBlock_00241d00;
  SmallArray<VmInstruction_*,_4U>::~SmallArray(&this->liveOut);
  SmallArray<VmInstruction_*,_4U>::~SmallArray(&this->liveIn);
  SmallArray<VmBlock_*,_4U>::~SmallArray(&this->dominanceChildren);
  SmallArray<VmBlock_*,_4U>::~SmallArray(&this->dominanceFrontier);
  SmallArray<VmBlock_*,_4U>::~SmallArray(&this->successors);
  SmallArray<VmBlock_*,_4U>::~SmallArray(&this->predecessors);
  (this->super_VmValue)._vptr_VmValue = (_func_int **)&PTR__VmValue_00241ca8;
  SmallArray<VmValue_*,_8U>::~SmallArray(&(this->super_VmValue).users);
  return;
}

Assistant:

VmBlock(Allocator *allocator, SynBase *source, InplaceStr name, unsigned uniqueId): VmValue(myTypeID, allocator, VmType::Block, source), name(name), uniqueId(uniqueId), predecessors(allocator), successors(allocator), dominanceFrontier(allocator), dominanceChildren(allocator), liveIn(allocator), liveOut(allocator)
	{
		parent = NULL;

		prevSibling = NULL;
		nextSibling = NULL;

		firstInstruction = NULL;
		lastInstruction = NULL;

		insertPoint = NULL;

		address = ~0u;

		visited = false;

		controlGraphPreOrderId = ~0u;
		controlGraphPostOrderId = ~0u;

		dominanceGraphPreOrderId = ~0u;
		dominanceGraphPostOrderId = ~0u;

		idom = NULL;

		hasAssignmentForId = 0;
		hasPhiNodeForId = 0;

		entryPc = NULL;
		exitPc = NULL;
	}